

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O2

idx_t __thiscall duckdb::LogicalGet::EstimateCardinality(LogicalGet *this,ClientContext *context)

{
  table_function_cardinality_t p_Var1;
  bool bVar2;
  int iVar3;
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> in_RAX;
  pointer pNVar4;
  reference this_00;
  pointer pLVar5;
  undefined4 extraout_var;
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> *puVar7;
  unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> node_stats;
  idx_t iVar6;
  
  if ((this->super_LogicalOperator).has_estimated_cardinality == true) {
    iVar6 = (this->super_LogicalOperator).estimated_cardinality;
  }
  else {
    p_Var1 = (this->function).cardinality;
    if (p_Var1 != (table_function_cardinality_t)0x0) {
      node_stats.
      super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>._M_t.
      super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
      .super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl =
           (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
           (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
           in_RAX._M_t.
           super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
           .super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl;
      (*p_Var1)((ClientContext *)&node_stats,(FunctionData *)context);
      bVar2 = true;
      puVar7 = &node_stats;
      if ((node_stats.
           super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>
           .super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl !=
           (__uniq_ptr_data<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true,_true>
            )0x0) &&
         (pNVar4 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                   ::operator->(&node_stats), puVar7 = &node_stats,
         pNVar4->has_estimated_cardinality == true)) {
        pNVar4 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                 ::operator->(&node_stats);
        puVar7 = (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                  *)pNVar4->estimated_cardinality;
        bVar2 = false;
      }
      ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
      ~unique_ptr(&node_stats.
                   super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
                 );
      if (!bVar2) {
        return (idx_t)(undefined1 *)puVar7;
      }
    }
    if ((this->super_LogicalOperator).children.
        super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->super_LogicalOperator).children.
        super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar6 = 1;
    }
    else {
      this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&(this->super_LogicalOperator).children,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(this_00);
      iVar3 = (*pLVar5->_vptr_LogicalOperator[7])(pLVar5,context);
      iVar6 = CONCAT44(extraout_var,iVar3);
    }
  }
  return iVar6;
}

Assistant:

idx_t LogicalGet::EstimateCardinality(ClientContext &context) {
	// join order optimizer does better cardinality estimation.
	if (has_estimated_cardinality) {
		return estimated_cardinality;
	}
	if (function.cardinality) {
		auto node_stats = function.cardinality(context, bind_data.get());
		if (node_stats && node_stats->has_estimated_cardinality) {
			return node_stats->estimated_cardinality;
		}
	}
	if (!children.empty()) {
		return children[0]->EstimateCardinality(context);
	}
	return 1;
}